

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void __thiscall ON_FixedSizePool::~ON_FixedSizePool(ON_FixedSizePool *this)

{
  undefined8 *puVar1;
  undefined8 *memblock;
  
  memblock = (undefined8 *)this->m_first_block;
  this->m_al_block = (void *)0x0;
  this->m_al_element_array = (void *)0x0;
  this->m_al_count = 0;
  this->m_sizeof_element = 0;
  this->m_block_element_count = 0;
  this->m_active_element_count = 0;
  this->m_total_element_count = 0;
  this->m_first_block = (void *)0x0;
  this->m_al_element_stack = (void *)0x0;
  this->m_sleep_lock = (atomic_flag)0x0;
  *(undefined3 *)&this->field_0x41 = 0;
  this->m_reserved0 = 0;
  while (memblock != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*memblock;
    onfree(memblock);
    memblock = puVar1;
  }
  return;
}

Assistant:

void ON_FixedSizePool::Destroy()
{
  void* p;
  void* next;
  next = m_first_block;
  memset(this,0,sizeof(*this));
  for ( p = next; 0 != p; p = next )
  {
    next = *((void**)p);
    onfree(p);
  }
}